

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O1

void __thiscall QMdiArea::QMdiArea(QMdiArea *this,QWidget *parent)

{
  QAbstractScrollAreaPrivate *this_00;
  QPalette *pQVar1;
  QBrush *brush;
  
  this_00 = (QAbstractScrollAreaPrivate *)operator_new(1000);
  QAbstractScrollAreaPrivate::QAbstractScrollAreaPrivate(this_00);
  *(undefined ***)&(this_00->super_QFramePrivate).super_QWidgetPrivate =
       &PTR__QMdiAreaPrivate_008037e0;
  memset(this_00 + 1,0,0xb0);
  QBrush::QBrush((QBrush *)&this_00[1].super_QFramePrivate.super_QWidgetPrivate.widgetItem);
  *(undefined8 *)((long)&this_00[1].super_QFramePrivate.super_QWidgetPrivate.extraPaintEngine + 7) =
       0;
  this_00[1].super_QFramePrivate.super_QWidgetPrivate.extraPaintEngine = (QPaintEngine *)0x0;
  this_00[1].super_QFramePrivate.super_QWidgetPrivate.graphicsEffect = (QGraphicsEffect *)0x0;
  this_00[1].super_QFramePrivate.super_QWidgetPrivate.imHints =
       (QFlagsStorageHelper<Qt::InputMethodHint,_4>)0x0;
  *(undefined4 *)&this_00[1].super_QFramePrivate.super_QWidgetPrivate.field_0xd4 = 0;
  *(undefined4 *)&this_00[1].super_QFramePrivate.super_QWidgetPrivate.opaqueChildren.d = 0xffffffff;
  *(undefined4 *)((long)&this_00[1].super_QFramePrivate.super_QWidgetPrivate.opaqueChildren.d + 4) =
       0xffffffff;
  *(undefined4 *)&this_00[1].super_QFramePrivate.super_QWidgetPrivate.dirty.d = 0xffffffff;
  *(undefined4 *)((long)&this_00[1].super_QFramePrivate.super_QWidgetPrivate.dirty.d + 4) =
       0xffffffff;
  this_00[1].super_QFramePrivate.super_QWidgetPrivate.toolTip.d.d = (Data *)0x0;
  QAbstractScrollArea::QAbstractScrollArea((QAbstractScrollArea *)this,this_00,parent);
  *(undefined ***)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget =
       &PTR_metaObject_008038b0;
  *(undefined ***)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.super_QPaintDevice =
       &PTR__QMdiArea_00803a88;
  pQVar1 = QWidget::palette((QWidget *)this);
  brush = (QBrush *)QPalette::brush((ColorGroup)pQVar1,Dark);
  setBackground(this,brush);
  QFrame::setFrameStyle((QFrame *)this,0);
  QAbstractScrollArea::setHorizontalScrollBarPolicy((QAbstractScrollArea *)this,ScrollBarAlwaysOff);
  QAbstractScrollArea::setVerticalScrollBarPolicy((QAbstractScrollArea *)this,ScrollBarAlwaysOff);
  QAbstractScrollArea::setViewport((QAbstractScrollArea *)this,(QWidget *)0x0);
  QWidget::setFocusPolicy((QWidget *)this,NoFocus);
  QObject::installEventFilter(QCoreApplication::self);
  return;
}

Assistant:

QMdiArea::QMdiArea(QWidget *parent)
    : QAbstractScrollArea(*new QMdiAreaPrivate, parent)
{
    setBackground(palette().brush(QPalette::Dark));
    setFrameStyle(QFrame::NoFrame);
    setHorizontalScrollBarPolicy(Qt::ScrollBarAlwaysOff);
    setVerticalScrollBarPolicy(Qt::ScrollBarAlwaysOff);
    setViewport(nullptr);
    setFocusPolicy(Qt::NoFocus);
    QApplication::instance()->installEventFilter(this);
}